

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_force_ip.cc
# Opt level: O2

int runForceIP(string *command,int argc,char **argv)

{
  int iVar1;
  uint64_t mac;
  bool bVar2;
  bool bVar3;
  int iVar4;
  type ip_00;
  type subnet;
  type gateway_00;
  ostream *poVar5;
  pointer pDVar6;
  char *pcVar7;
  string p;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> devices;
  array<unsigned_char,_4UL> gateway;
  array<unsigned_char,_4UL> mask;
  array<unsigned_char,_4UL> ip;
  DeviceFilter local_a8;
  
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = 0;
  bVar3 = false;
  while (iVar4 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&p,argv[iVar4],(allocator<char> *)&devices);
    iVar1 = iVar4 + 1;
    bVar2 = std::operator==(&p,"-y");
    if (bVar2) {
      bVar3 = true;
      iVar4 = iVar1;
    }
    else {
      bVar2 = std::operator==(&p,"-f");
      if (!bVar2) {
        bVar2 = std::operator==(&p,"-h");
        if (bVar2) {
LAB_001126b6:
          iVar4 = 0;
          printHelp((ostream *)&std::cout,command);
        }
        else {
          bVar2 = std::operator==(&p,"--help");
          if (bVar2) goto LAB_001126b6;
          if ((p._M_string_length == 0) || (*p._M_dataplus._M_p != '-')) {
            std::__cxx11::string::~string((string *)&p);
            break;
          }
          poVar5 = std::operator<<((ostream *)&std::cerr,"Invalid argument: ");
          poVar5 = std::operator<<(poVar5,(string *)&p);
          std::operator<<(poVar5,'\n');
          printHelp((ostream *)&std::cerr,command);
          iVar4 = 1;
        }
        std::__cxx11::string::~string((string *)&p);
        goto LAB_001128b5;
      }
      iVar4 = parseFilterArguments(argc - iVar1,argv + iVar1,&local_a8);
      iVar4 = iVar1 + iVar4;
    }
    std::__cxx11::string::~string((string *)&p);
  }
  if (((local_a8.mac.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_a8.mac.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) &&
      (local_a8.name.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_a8.name.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     (local_a8.serial.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_a8.serial.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pcVar7 = "No filter set";
  }
  else {
    if (iVar4 + 3 == argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&p,argv[iVar4],(allocator<char> *)&devices);
      ip = string2ip(&p);
      std::__cxx11::string::~string((string *)&p);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&p,argv[(long)iVar4 + 1],(allocator<char> *)&devices);
      mask = string2ip(&p);
      std::__cxx11::string::~string((string *)&p);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&p,argv[(long)iVar4 + 2],(allocator<char> *)&devices);
      gateway = string2ip(&p);
      std::__cxx11::string::~string((string *)&p);
      discoverWithFilter(&devices,&local_a8);
      if (devices.
          super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          devices.
          super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pcVar7 = "No device found";
LAB_00112892:
        poVar5 = std::operator<<((ostream *)&std::cout,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      else {
        if ((ulong)((long)devices.
                          super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)devices.
                         super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x101) {
          std::operator<<((ostream *)&std::cout,"Setting the IP address of the following device:\n")
          ;
          printDeviceTable((ostream *)&std::cout,&devices,true,false,false);
          if (!bVar3) {
            std::operator<<((ostream *)&std::cout,"Are you sure? [y/N] ");
            p._M_dataplus._M_p = (pointer)&p.field_2;
            p._M_string_length = 0;
            p.field_2._M_local_buf[0] = '\0';
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,(string *)&p);
            bVar3 = std::operator!=(&p,"y");
            if (bVar3) {
              bVar3 = std::operator!=(&p,"Y");
              if (bVar3) {
                poVar5 = std::operator<<((ostream *)&std::cout,"Cancel");
                std::endl<char,std::char_traits<char>>(poVar5);
                std::__cxx11::string::~string((string *)&p);
                goto LAB_001128a9;
              }
            }
            std::__cxx11::string::~string((string *)&p);
          }
          pcVar7 = "Done";
          for (pDVar6 = devices.
                        super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pDVar6 != devices.
                        super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pDVar6 = pDVar6 + 1) {
            rcdiscover::ForceIP::ForceIP((ForceIP *)&p);
            mac = pDVar6->mac;
            ip_00 = byteArrayToInt<4ul>(&ip);
            subnet = byteArrayToInt<4ul>(&mask);
            gateway_00 = byteArrayToInt<4ul>(&gateway);
            rcdiscover::ForceIP::sendCommand((ForceIP *)&p,mac,ip_00,subnet,gateway_00);
            std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::~vector
                      ((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
                       &p);
          }
          goto LAB_00112892;
        }
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "Found more than one device matching the filter criteria.");
        std::endl<char,std::char_traits<char>>(poVar5);
        printDeviceTable((ostream *)&std::cout,&devices,true,false,false);
      }
LAB_001128a9:
      std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
                (&devices);
      iVar4 = 0;
      goto LAB_001128b5;
    }
    pcVar7 = "IP address, subnet mask and default gateway must be set";
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,pcVar7);
  std::endl<char,std::char_traits<char>>(poVar5);
  printHelp((ostream *)&std::cerr,command);
  iVar4 = 1;
LAB_001128b5:
  DeviceFilter::~DeviceFilter(&local_a8);
  return iVar4;
}

Assistant:

int runForceIP(const std::string &command, int argc, char **argv)
{
  DeviceFilter device_filter{};
  bool yes = false;

  int i = 0;
  while (i < argc)
  {
    std::string p = argv[i++];

    if (p == "-y")
    {
      yes = true;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        printHelp(std::cerr, command);
        return 1;
      }
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else if (!p.empty() && p[0] == '-')
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
    else
    {
      --i;
      break;
    }
  }

  if (device_filter.mac.empty() &&
      device_filter.name.empty() &&
      device_filter.serial.empty())
  {
    std::cerr << "No filter set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  if (i + 3 != argc)
  {
    std::cerr << "IP address, subnet mask and default gateway must be set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  std::array<uint8_t, 4> ip;
  std::array<uint8_t, 4> mask;
  std::array<uint8_t, 4> gateway;

  try
  {
    ip = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse IP address" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  try
  {
    mask = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse subnet mask" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  try
  {
    gateway = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse default gateway" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  const auto devices = discoverWithFilter(device_filter);

  if (devices.empty())
  {
    std::cout << "No device found" << std::endl;
    return 0;
  }

  if (devices.size() > 1)
  {
    std::cout << "Found more than one device matching the filter criteria." << std::endl;
    printDeviceTable(std::cout, devices, true, false, false);
    return 0;
  }

  std::cout << "Setting the IP address of the following device:\n";
  printDeviceTable(std::cout, devices, true, false, false);

  if (!yes)
  {
    std::cout << "Are you sure? [y/N] ";
    std::string answer;
    std::getline(std::cin, answer);
    if (answer != "y" && answer != "Y")
    {
      std::cout << "Cancel" << std::endl;
      return 0;
    }
  }

  for (const auto &device : devices)
  {
    rcdiscover::ForceIP force_ip;
    force_ip.sendCommand(device.getMAC(),
                         byteArrayToInt(ip),
                         byteArrayToInt(mask),
                         byteArrayToInt(gateway));
  }

  std::cout << "Done" << std::endl;

  return 0;
}